

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_utils.c
# Opt level: O0

int WebPRescalerExport(WebPRescaler *rescaler)

{
  int iVar1;
  int total_exported;
  undefined4 in_stack_fffffffffffffff0;
  int iVar2;
  
  iVar2 = 0;
  while( true ) {
    iVar1 = WebPRescalerHasPendingOutput((WebPRescaler *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    if (iVar1 == 0) break;
    WebPRescalerExportRow((WebPRescaler *)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    iVar2 = iVar2 + 1;
  }
  return iVar2;
}

Assistant:

int WebPRescalerExport(WebPRescaler* const rescaler) {
  int total_exported = 0;
  while (WebPRescalerHasPendingOutput(rescaler)) {
    WebPRescalerExportRow(rescaler);
    ++total_exported;
  }
  return total_exported;
}